

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O0

uint __thiscall
ON_SubDQuadNeighborhood::SetLimitSubSurfaceExactCVs
          (ON_SubDQuadNeighborhood *this,bool bEnableApproximatePatch,uint quadrant_index)

{
  byte bVar1;
  ON_SubDEdge *pOVar2;
  ON_SubDFace *pOVar3;
  bool bVar4;
  uint uVar5;
  double (*padVar6) [3];
  ON_2dex OVar7;
  ON_2dex OVar8;
  double (*padVar9) [3];
  byte local_209;
  uint local_208;
  uint local_204;
  uint local_200;
  double b;
  double c;
  ON_SubDFace *face_ij;
  int local_188;
  int iStack_184;
  ON_2dex fdex;
  ON_SubDEdge *edge;
  double *B;
  double *A;
  int iStack_160;
  ON_2dex Bdex;
  ON_2dex Adex;
  bool bCenterEdgeCrease;
  uint local_13c;
  uint side_fvi;
  uint side_pass;
  uint fvi3;
  uint set_cv_count;
  uint fvi;
  uint exact_quadrant_count;
  uint set_quadrant_count;
  uint fvi_max;
  uint fvi_min;
  uint fei;
  ON_2dex srf_cv_dex [8];
  double *P1 [3];
  double local_b8;
  double Q [3] [3];
  uint i;
  ON_SubDFace *face;
  int iStack_58;
  ON_2dex deltadex;
  ON_2dex dex;
  uint i_1;
  ON_SubDVertex *center_vertices [4];
  uchar subdivision_count;
  uint quadrant_index_local;
  bool bEnableApproximatePatch_local;
  ON_SubDQuadNeighborhood *this_local;
  
  if (this->m_initial_subdivision_level < this->m_current_subdivision_level) {
    bVar1 = this->m_current_subdivision_level;
  }
  else {
    bVar1 = 0;
  }
  subdivision_count = bEnableApproximatePatch;
  if ((bEnableApproximatePatch) && ((bVar1 < 2 || (1 < this->m_extraordinary_corner_vertex_count))))
  {
    ON_SubDIncrementErrorCount();
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_limit.cpp"
               ,0x543,"","bEnableApproximatePatch should be false at this stage.");
    subdivision_count = '\0';
  }
  if (((this->m_face_grid[1][1] == (ON_SubDFace *)0x0) ||
      (this->m_face_grid[1][1]->m_edge_count != 4)) || (4 < quadrant_index)) {
    ON_SubDIncrementErrorCount();
    this_local._4_4_ = 0;
  }
  else {
    stack0xffffffffffffffb8 = this->m_vertex_grid[1][1];
    for (dex.i = 0; (uint)dex.i < 4; dex.i = dex.i + 1) {
      if (*(long *)&(&dex)[(uint)dex.i].j == 0) {
        ON_SubDIncrementErrorCount();
        return 0;
      }
      if (this->m_center_edges[(uint)dex.i] == (ON_SubDEdge *)0x0) {
        ON_SubDIncrementErrorCount();
        return 0;
      }
    }
    bVar4 = ON_IsValid(this->m_srf_cv1[2][2][0]);
    if (!bVar4) {
      bVar4 = ON_SubDFace::GetSubdivisionPoint(this->m_face_grid[1][1],Q[1] + 2);
      if (!bVar4) {
        ON_SubDIncrementErrorCount();
        return 0;
      }
      ON_2dex::ON_2dex((ON_2dex *)&fvi_min,1,1);
      ON_2dex::ON_2dex(srf_cv_dex,2,1);
      ON_2dex::ON_2dex(srf_cv_dex + 1,3,1);
      ON_2dex::ON_2dex(srf_cv_dex + 2,3,2);
      ON_2dex::ON_2dex(srf_cv_dex + 3,3,3);
      ON_2dex::ON_2dex(srf_cv_dex + 4,2,3);
      ON_2dex::ON_2dex(srf_cv_dex + 5,1,3);
      ON_2dex::ON_2dex(srf_cv_dex + 6,1,2);
      for (fvi_max = 0; fvi_max < 4; fvi_max = fvi_max + 1) {
        bVar4 = ON_SubDVertex::GetSubdivisionPoint(*(ON_SubDVertex **)&(&dex)[fvi_max].j,&local_b8);
        if (!bVar4) {
          ON_SubDIncrementErrorCount();
          return 0;
        }
        bVar4 = ON_SubDEdge::GetSubdivisionPoint(this->m_center_edges[fvi_max],Q[0] + 2);
        if (!bVar4) {
          ON_SubDIncrementErrorCount();
          return 0;
        }
        deltadex.i = (int)*(undefined8 *)(&fvi_min + (ulong)(fvi_max << 1) * 2);
        deltadex.j = (int)((ulong)*(undefined8 *)(&fvi_min + (ulong)(fvi_max << 1) * 2) >> 0x20);
        srf_cv_dex[7] = (ON_2dex)(this->m_srf_cv1[deltadex.i] + deltadex.j);
        *(double *)srf_cv_dex[7] = local_b8;
        *(double *)((long)srf_cv_dex[7] + 8) = Q[0][0];
        *(double *)((long)srf_cv_dex[7] + 0x10) = Q[0][1];
        deltadex.i = (int)*(undefined8 *)(&fvi_min + (ulong)(fvi_max * 2 + 1) * 2);
        deltadex.j = (int)((ulong)*(undefined8 *)(&fvi_min + (ulong)(fvi_max * 2 + 1) * 2) >> 0x20);
        padVar6 = this->m_srf_cv1[deltadex.i] + deltadex.j;
        (*padVar6)[0] = Q[0][2];
        (*padVar6)[1] = Q[1][0];
        (*padVar6)[2] = Q[1][1];
      }
      this->m_srf_cv1[2][2][0] = Q[1][2];
      this->m_srf_cv1[2][2][1] = Q[2][0];
      this->m_srf_cv1[2][2][2] = Q[2][1];
    }
    if (quadrant_index == 4) {
      local_200 = 0;
      local_204 = 4;
      fvi3 = local_200;
    }
    else {
      local_204 = quadrant_index + 1;
      fvi3 = quadrant_index;
    }
    fvi = 0;
    set_cv_count = 0;
    for (; fvi3 < local_204; fvi3 = fvi3 + 1) {
      if ((this->m_bExactQuadrantPatch[fvi3] & 1U) == 0) {
        if ((subdivision_count & 1) != 0) goto LAB_008febfb;
      }
      else {
        set_cv_count = set_cv_count + 1;
LAB_008febfb:
        side_pass = 9;
        uVar5 = fvi3 + 3 & 3;
        for (local_13c = 0; local_13c < 2; local_13c = local_13c + 1) {
          local_208 = uVar5;
          if (local_13c == 0) {
            local_208 = fvi3;
          }
          OVar7 = GridDex(5,local_208,1,0);
          OVar8 = DeltaDex(local_208,1,0);
          deltadex.i = OVar7.i;
          deltadex.j = OVar7.j;
          srf_cv_dex[7] = (ON_2dex)(this->m_srf_cv1[deltadex.i] + deltadex.j);
          face._4_4_ = OVar8.i;
          iStack_58 = OVar8.j;
          bVar4 = ON_IsValid(*(double *)srf_cv_dex[7]);
          if (((bVar4) &&
              (bVar4 = ON_IsValid(this->m_srf_cv1[face._4_4_ + deltadex.i][iStack_58 + deltadex.j]
                                  [0]), bVar4)) &&
             (bVar4 = ON_IsValid(this->m_srf_cv1[face._4_4_ + face._4_4_ + deltadex.i]
                                 [iStack_58 + iStack_58 + deltadex.j][0]), bVar4)) {
            side_pass = side_pass + 3;
          }
          else {
            if ((subdivision_count & 1) == 0) {
              local_209 = this->m_bBoundaryCrease[local_208];
            }
            else {
              local_209 = ON_SubDEdge::IsCrease(this->m_center_edges[local_208]);
            }
            if ((local_209 & 1) == 0) {
              if ((((this->m_bExactQuadrantPatch[fvi3] & 1U) == 0) && (bVar1 < 2)) ||
                 (bVar4 = ON_SubDEdge::IsSmoothNotX(this->m_center_edges[local_208]), !bVar4))
              goto LAB_008ff2ff;
              pOVar2 = this->m_edge_grid[local_208][0];
              if (pOVar2 == (ON_SubDEdge *)0x0) {
                if ((this->m_bExactQuadrantPatch[fvi3] & 1U) != 0) {
                  ON_SubDIncrementErrorCount();
                  return 0;
                }
                local_b8 = -1.23432101234321e+308;
              }
              else {
                bVar4 = ON_SubDEdge::GetSubdivisionPoint(pOVar2,&local_b8);
                if (!bVar4) {
                  ON_SubDIncrementErrorCount();
                  return 0;
                }
              }
              OVar7 = GridDex(3,local_208,1,0);
              local_188 = OVar7.i;
              iStack_184 = OVar7.j;
              pOVar3 = this->m_face_grid[local_188][iStack_184];
              if (pOVar3 == (ON_SubDFace *)0x0) {
                if ((this->m_bExactQuadrantPatch[fvi3] & 1U) != 0) {
                  ON_SubDIncrementErrorCount();
                  return 0;
                }
                Q[0][2] = -1.23432101234321e+308;
              }
              else {
                bVar4 = ON_SubDFace::GetSubdivisionPoint(pOVar3,Q[0] + 2);
                if (!bVar4) {
                  ON_SubDIncrementErrorCount();
                  return 0;
                }
              }
              pOVar2 = this->m_edge_grid[local_208][1];
              if (pOVar2 == (ON_SubDEdge *)0x0) {
                if ((this->m_bExactQuadrantPatch[fvi3] & 1U) != 0) {
                  ON_SubDIncrementErrorCount();
                  return 0;
                }
                Q[1][2] = -1.23432101234321e+308;
              }
              else {
                bVar4 = ON_SubDEdge::GetSubdivisionPoint(pOVar2,Q[1] + 2);
                if (!bVar4) {
                  ON_SubDIncrementErrorCount();
                  return 0;
                }
              }
            }
            else {
              Bdex = GridDex(5,local_208,1,1);
              register0x00000000 = GridDex(5,local_208,1,2);
              for (Q[2][2]._4_4_ = 0; Q[2][2]._4_4_ < 3; Q[2][2]._4_4_ = Q[2][2]._4_4_ + 1) {
                padVar9 = this->m_srf_cv1[Bdex.i] + Bdex.j;
                padVar6 = this->m_srf_cv1[A._4_4_] + iStack_160;
                Q[(ulong)Q[2][2]._4_4_ - 1][2] = (*padVar9)[0] + (*padVar9)[0] + -(*padVar6)[0];
                Q[Q[2][2]._4_4_][0] = (*padVar9)[1] + (*padVar9)[1] + -(*padVar6)[1];
                Q[Q[2][2]._4_4_][1] = (*padVar9)[2] + (*padVar9)[2] + -(*padVar6)[2];
                Bdex.j = iStack_58 + Bdex.j;
                Bdex.i = face._4_4_ + Bdex.i;
                iStack_160 = iStack_58 + iStack_160;
                A._4_4_ = face._4_4_ + A._4_4_;
              }
            }
            for (Q[2][2]._4_4_ = 0; Q[2][2]._4_4_ < 3; Q[2][2]._4_4_ = Q[2][2]._4_4_ + 1) {
              bVar4 = ON_IsValid(*(double *)srf_cv_dex[(ulong)Q[2][2]._4_4_ + 7]);
              if (bVar4) {
                side_pass = side_pass + 1;
              }
              else {
                bVar4 = ON_IsValid(Q[(ulong)Q[2][2]._4_4_ - 1][2]);
                if (bVar4) {
                  side_pass = side_pass + 1;
                  *(double *)srf_cv_dex[(ulong)Q[2][2]._4_4_ + 7] = Q[(ulong)Q[2][2]._4_4_ - 1][2];
                  *(double *)((long)srf_cv_dex[(ulong)Q[2][2]._4_4_ + 7] + 8) = Q[Q[2][2]._4_4_][0];
                  *(double *)((long)srf_cv_dex[(ulong)Q[2][2]._4_4_ + 7] + 0x10) =
                       Q[Q[2][2]._4_4_][1];
                }
              }
            }
          }
LAB_008ff2ff:
        }
        if (((this->m_bExactQuadrantPatch[fvi3] & 1U) != 0) ||
           (((this->m_bExtraordinaryCornerVertex[fvi3] & 1U) == 0 && ((subdivision_count & 1) != 0))
           )) {
          OVar7 = GridDex(5,fvi3,0,0);
          deltadex.i = OVar7.i;
          deltadex.j = OVar7.j;
          srf_cv_dex[7] = (ON_2dex)(this->m_srf_cv1[deltadex.i] + deltadex.j);
          bVar4 = ON_IsValid(*(double *)srf_cv_dex[7]);
          if (bVar4) {
            side_pass = side_pass + 1;
          }
          else {
            bVar4 = ON_SubDVertex::IsSmooth(*(ON_SubDVertex **)&(&dex)[fvi3].j);
            if (bVar4) {
              if ((*(short *)(*(long *)&(&dex)[fvi3].j + 0x68) == 4) &&
                 (*(short *)(*(long *)&(&dex)[fvi3].j + 0x6a) == 4)) {
                OVar7 = GridDex(3,fvi3,0,0);
                deltadex.i = OVar7.i;
                deltadex.j = OVar7.j;
                pOVar3 = this->m_face_grid[deltadex.i][deltadex.j];
                if (pOVar3 == (ON_SubDFace *)0x0) {
                  ON_SubDIncrementErrorCount();
                  return 0;
                }
                bVar4 = ON_SubDFace::GetSubdivisionPoint(pOVar3,&local_b8);
                if (!bVar4) {
                  ON_SubDIncrementErrorCount();
                  return 0;
                }
                side_pass = side_pass + 1;
                *(double *)srf_cv_dex[7] = local_b8;
                *(double *)((long)srf_cv_dex[7] + 8) = Q[0][0];
                *(double *)((long)srf_cv_dex[7] + 0x10) = Q[0][1];
              }
            }
            else {
              bVar4 = ON_SubDVertex::IsCrease(*(ON_SubDVertex **)&(&dex)[fvi3].j);
              if (bVar4) {
                if (((this->m_bBoundaryCrease[fvi3] & 1U) == 0) ||
                   ((this->m_bBoundaryCrease[uVar5] & 1U) == 0)) {
                  if (((this->m_bBoundaryCrease[fvi3] & 1U) == 0) ||
                     ((this->m_bBoundaryCrease[uVar5] & 1U) != 0)) {
                    if (((this->m_bBoundaryCrease[fvi3] & 1U) == 0) &&
                       ((this->m_bBoundaryCrease[uVar5] & 1U) != 0)) {
                      OVar7 = GridDex(5,fvi3,1,0);
                      deltadex.i = OVar7.i;
                      deltadex.j = OVar7.j;
                      local_b8 = this->m_srf_cv1[deltadex.i][deltadex.j][0];
                      Q[0][0] = this->m_srf_cv1[deltadex.i][deltadex.j][1];
                      Q[0][1] = this->m_srf_cv1[deltadex.i][deltadex.j][2];
                      OVar7 = GridDex(5,fvi3,2,0);
                      deltadex.i = OVar7.i;
                      deltadex.j = OVar7.j;
                      Q[0][2] = this->m_srf_cv1[deltadex.i][deltadex.j][0];
                      Q[1][0] = this->m_srf_cv1[deltadex.i][deltadex.j][1];
                      Q[1][1] = this->m_srf_cv1[deltadex.i][deltadex.j][2];
                      bVar4 = ON_IsValid(local_b8);
                      if ((bVar4) && (bVar4 = ON_IsValid(Q[0][2]), bVar4)) {
                        side_pass = side_pass + 1;
                        *(double *)srf_cv_dex[7] = local_b8 + local_b8 + -Q[0][2];
                        *(double *)((long)srf_cv_dex[7] + 8) = Q[0][0] + Q[0][0] + -Q[1][0];
                        *(double *)((long)srf_cv_dex[7] + 0x10) = Q[0][1] + Q[0][1] + -Q[1][1];
                      }
                    }
                    else if ((this->m_bExactQuadrantPatch[fvi3] & 1U) != 0) {
                      ON_SubDIncrementErrorCount();
                      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_limit.cpp"
                                 ,0x661,"","Why is this happening?");
                    }
                  }
                  else {
                    OVar7 = GridDex(5,fvi3,0,1);
                    deltadex.i = OVar7.i;
                    deltadex.j = OVar7.j;
                    local_b8 = this->m_srf_cv1[deltadex.i][deltadex.j][0];
                    Q[0][0] = this->m_srf_cv1[deltadex.i][deltadex.j][1];
                    Q[0][1] = this->m_srf_cv1[deltadex.i][deltadex.j][2];
                    OVar7 = GridDex(5,fvi3,0,2);
                    deltadex.i = OVar7.i;
                    deltadex.j = OVar7.j;
                    Q[0][2] = this->m_srf_cv1[deltadex.i][deltadex.j][0];
                    Q[1][0] = this->m_srf_cv1[deltadex.i][deltadex.j][1];
                    Q[1][1] = this->m_srf_cv1[deltadex.i][deltadex.j][2];
                    bVar4 = ON_IsValid(local_b8);
                    if ((bVar4) && (bVar4 = ON_IsValid(Q[0][2]), bVar4)) {
                      side_pass = side_pass + 1;
                      *(double *)srf_cv_dex[7] = local_b8 + local_b8 + -Q[0][2];
                      *(double *)((long)srf_cv_dex[7] + 8) = Q[0][0] + Q[0][0] + -Q[1][0];
                      *(double *)((long)srf_cv_dex[7] + 0x10) = Q[0][1] + Q[0][1] + -Q[1][1];
                    }
                  }
                }
                else {
                  OVar7 = GridDex(5,fvi3,2,1);
                  deltadex.i = OVar7.i;
                  deltadex.j = OVar7.j;
                  local_b8 = this->m_srf_cv1[deltadex.i][deltadex.j][0];
                  Q[0][0] = this->m_srf_cv1[deltadex.i][deltadex.j][1];
                  Q[0][1] = this->m_srf_cv1[deltadex.i][deltadex.j][2];
                  OVar7 = GridDex(5,fvi3,1,2);
                  deltadex.i = OVar7.i;
                  deltadex.j = OVar7.j;
                  Q[0][2] = this->m_srf_cv1[deltadex.i][deltadex.j][0];
                  Q[1][0] = this->m_srf_cv1[deltadex.i][deltadex.j][1];
                  Q[1][1] = this->m_srf_cv1[deltadex.i][deltadex.j][2];
                  OVar7 = GridDex(5,fvi3,2,2);
                  deltadex.i = OVar7.i;
                  deltadex.j = OVar7.j;
                  Q[1][2] = this->m_srf_cv1[deltadex.i][deltadex.j][0];
                  Q[2][0] = this->m_srf_cv1[deltadex.i][deltadex.j][1];
                  Q[2][1] = this->m_srf_cv1[deltadex.i][deltadex.j][2];
                  bVar4 = ON_IsValid(local_b8);
                  if (((bVar4) && (bVar4 = ON_IsValid(Q[0][2]), bVar4)) &&
                     (bVar4 = ON_IsValid(Q[1][2]), bVar4)) {
                    OVar7 = GridDex(5,fvi3,1,1);
                    deltadex.i = OVar7.i;
                    deltadex.j = OVar7.j;
                    bVar4 = ON_IsValid(this->m_srf_cv1[deltadex.i][deltadex.j][0]);
                    if (bVar4) {
                      side_pass = side_pass + 1;
                      *(double *)srf_cv_dex[7] =
                           this->m_srf_cv1[deltadex.i][deltadex.j][0] * -8.0 +
                           (local_b8 + Q[0][2]) * 4.0 + Q[1][2];
                      *(double *)((long)srf_cv_dex[7] + 8) =
                           this->m_srf_cv1[deltadex.i][deltadex.j][1] * -8.0 +
                           (Q[0][0] + Q[1][0]) * 4.0 + Q[2][0];
                      *(double *)((long)srf_cv_dex[7] + 0x10) =
                           this->m_srf_cv1[deltadex.i][deltadex.j][2] * -8.0 +
                           (Q[0][1] + Q[1][1]) * 4.0 + Q[2][1];
                    }
                  }
                }
              }
            }
          }
        }
        if (side_pass == 0x10) {
          fvi = fvi + 1;
        }
      }
    }
    if (fvi < set_cv_count) {
      ON_SubDIncrementErrorCount();
      this_local._4_4_ = fvi;
    }
    else {
      this_local._4_4_ = fvi;
    }
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_SubDQuadNeighborhood::SetLimitSubSurfaceExactCVs(
  bool bEnableApproximatePatch,
  unsigned int quadrant_index
  )
{
  // When subdivision_count >= 2, there should be 3 or 4 or more exact quadrants.
  // When the original SubD face is an n-gon, it is subdivided into quads and m_initial_subdivision_level = 1.
  const unsigned char subdivision_count
    = (m_current_subdivision_level > m_initial_subdivision_level)
    ? m_current_subdivision_level
    : 0;  if (bEnableApproximatePatch && (subdivision_count < 2 || m_extraordinary_corner_vertex_count > 1))
  {
    ON_SUBD_ERROR("bEnableApproximatePatch should be false at this stage.");
    bEnableApproximatePatch = false;
  }

  if (nullptr == m_face_grid[1][1] || 4 != m_face_grid[1][1]->m_edge_count || quadrant_index > 4)
    return ON_SUBD_RETURN_ERROR(0);

  // faces_vertices[] face, in counterclockwise order.  
  // m_center_edges[] are the 4 edges of face in counterclockwise order with 
  // m_center_edges[0] connecting face_vertices[0] and face_vertices[1].
  // However, it may be that face->Vertex(0) != face_vertices[0].
  const ON_SubDVertex* center_vertices[4] = { m_vertex_grid[1][1], m_vertex_grid[2][1], m_vertex_grid[2][2], m_vertex_grid[1][2] };
  for (unsigned int i = 0; i < 4; i++)
  {
    if (nullptr == center_vertices[i])
      return ON_SUBD_RETURN_ERROR(0);
    if (nullptr == m_center_edges[i])
      return ON_SUBD_RETURN_ERROR(0);
  }

  ON_2dex dex;
  ON_2dex deltadex;
  const ON_SubDFace* face;
  unsigned int i;
  double Q[3][3];
  double* P1[3];

  if (!ON_IsValid(m_srf_cv1[2][2][0]))
  {
    // All sub surfaces require inner 3x3 grid of subdivision points
    // In all cases these are the 9 subdivision points of the central quad
    // 9 points
    // = the quad face subdivision point at m_srf_cv1[2][2]
    // + 4 edge subdivision pointsat m_srf_cv1[2][1], m_srf_cv1[3][2], m_srf_cv1[2][3], m_srf_cv1[1][2]
    // + 4 vertex subdivision points at m_srf_cv1[1][1], m_srf_cv1[3][1], m_srf_cv1[3][3], m_srf_cv1[1][3] 
    face = m_face_grid[1][1];

    // The value of m_srf_cv1[2][2][0] is used to determine when the inner 3x3 grid is set, 
    // so its value must be set after the 8 cvs around it are successfully set.
    // The value 
    //   Q[2] = face subd point 
    // is calculated here because if face->GetSubdivisionPoint() fails,
    // nothing below should succeed. The value of Q[2] is assigned to m_srf_cv1[2][2]
    // after the 8 ring points are successfully calculated.
    if (!face->GetSubdivisionPoint(Q[2]))
    {
      return ON_SUBD_RETURN_ERROR(0);
    }


    const ON_2dex srf_cv_dex[8] = { { 1, 1 }, { 2, 1 }, { 3, 1 }, { 3, 2 }, { 3, 3 }, { 2, 3 }, { 1, 3 }, { 1, 2 } };

    for (unsigned int fei = 0; fei < 4; fei++)
    {
      if (!center_vertices[fei]->GetSubdivisionPoint( Q[0]))
        return ON_SUBD_RETURN_ERROR(0);
      if (!m_center_edges[fei]->GetSubdivisionPoint( Q[1]))
        return ON_SUBD_RETURN_ERROR(0);

      dex = srf_cv_dex[2 * fei];
      P1[0] = m_srf_cv1[dex.i][dex.j];
      P1[0][0] = Q[0][0]; P1[0][1] = Q[0][1]; P1[0][2] = Q[0][2];

      dex = srf_cv_dex[2 * fei + 1];
      P1[1] = m_srf_cv1[dex.i][dex.j];
      P1[1][0] = Q[1][0]; P1[1][1] = Q[1][1]; P1[1][2] = Q[1][2];
    }

    // m_srf_cv1[2][2][0] is used to determine when the inner 3x3 grid is set, 
    // so its value must be set after the 8 cvs around it are successfully set.
    P1[2] = m_srf_cv1[2][2];
    P1[2][0] = Q[2][0]; P1[2][1] = Q[2][1]; P1[2][2] = Q[2][2];
  }

  const unsigned int fvi_min = (4 == quadrant_index) ? 0 : quadrant_index;
  const unsigned int fvi_max = (4 == quadrant_index) ? 4 : fvi_min+1;
  unsigned int set_quadrant_count = 0;
  unsigned int exact_quadrant_count = 0;
  for (unsigned int fvi = fvi_min; fvi < fvi_max; fvi++)
  {
    if (m_bExactQuadrantPatch[fvi])
      ++exact_quadrant_count;
    else if (false == bEnableApproximatePatch)
      continue;

    unsigned int set_cv_count = 9; // 3x3 grid is set

    const unsigned int fvi3 = (fvi + 3) % 4;

    for (unsigned int side_pass = 0; side_pass < 2; side_pass++)
    {
      const unsigned int side_fvi = (0 == side_pass) ? fvi : fvi3;

      dex = ON_SubDQuadNeighborhood::GridDex(5, side_fvi, 1, 0);
      deltadex = ON_SubDQuadNeighborhood::DeltaDex(side_fvi, 1, 0);
      P1[0] = &m_srf_cv1[dex.i][dex.j][0];
      dex.i += deltadex.i;
      dex.j += deltadex.j;
      P1[1] = &m_srf_cv1[dex.i][dex.j][0];
      dex.i += deltadex.i;
      dex.j += deltadex.j;
      P1[2] = &m_srf_cv1[dex.i][dex.j][0];
      if (ON_IsValid(P1[0][0]) && ON_IsValid(P1[1][0]) && ON_IsValid(P1[2][0]))
      {
        set_cv_count += 3;
        continue; // Already set
      }

      // m_bBoundaryCrease[] is true if m_center_edges[fvi]->IsCrease() is true AND neither end is a dart vertex.
      // Using bCenterEdgeCrease0 is required to get correct results when bEnableApproximatePatch is true
      const bool bCenterEdgeCrease = bEnableApproximatePatch ? m_center_edges[side_fvi]->IsCrease() : m_bBoundaryCrease[side_fvi];

      if ( bCenterEdgeCrease )
      {
        // When approximation is being applied (m_bExactQuadrantPatch[fvi] is false and bEnableApproximatePatch is true),
        // This technique insures the approximations on either side of the crease 
        // create a continuous edge.
        ON_2dex Adex = ON_SubDQuadNeighborhood::GridDex(5, side_fvi, 1, 1);
        ON_2dex Bdex = ON_SubDQuadNeighborhood::GridDex(5, side_fvi, 1, 2);
        for (i = 0; i < 3; i++)
        {
          const double* A = m_srf_cv1[Adex.i][Adex.j];
          const double* B = m_srf_cv1[Bdex.i][Bdex.j];
          Q[i][0] = 2.0*A[0] - B[0];
          Q[i][1] = 2.0*A[1] - B[1];
          Q[i][2] = 2.0*A[2] - B[2];
          Adex.i += deltadex.i;
          Adex.j += deltadex.j;
          Bdex.i += deltadex.i;
          Bdex.j += deltadex.j;
        }
      }
      else if ( (m_bExactQuadrantPatch[fvi] || subdivision_count >= 2) && m_center_edges[side_fvi]->IsSmoothNotX() )
      {
        const ON_SubDEdge* edge = m_edge_grid[side_fvi][0];
        if (nullptr == edge)
        {
          if (m_bExactQuadrantPatch[fvi])
            return ON_SUBD_RETURN_ERROR(0);
          Q[0][0] = ON_UNSET_VALUE;
        }
        else if (!edge->GetSubdivisionPoint(Q[0]))
          return ON_SUBD_RETURN_ERROR(0);

        const ON_2dex fdex = ON_SubDQuadNeighborhood::GridDex(3, side_fvi, 1, 0);
        face = m_face_grid[fdex.i][fdex.j];
        if (nullptr == face)
        {
          if (m_bExactQuadrantPatch[fvi])
            return ON_SUBD_RETURN_ERROR(0);
          Q[1][0] = ON_UNSET_VALUE;
        }
        else if (!face->GetSubdivisionPoint(Q[1]))
          return ON_SUBD_RETURN_ERROR(0);

        edge = m_edge_grid[side_fvi][1];
        if (nullptr == edge)
        {
          if (m_bExactQuadrantPatch[fvi])
            return ON_SUBD_RETURN_ERROR(0);
          Q[2][0] = ON_UNSET_VALUE;
        }
        else if (!edge->GetSubdivisionPoint(Q[2]))
          return ON_SUBD_RETURN_ERROR(0);
      }
      else
      {
        // Need more subdivisions before these can be set.
        continue;
      }

      for (i = 0; i < 3; i++)
      {
        if (ON_IsValid(P1[i][0]))
        {
          ++set_cv_count;
          continue;
        }
        if (ON_IsValid(Q[i][0]))
        {
          ++set_cv_count;
          P1[i][0] = Q[i][0];
          P1[i][1] = Q[i][1];
          P1[i][2] = Q[i][2];
        }
      }
    }

    if (
      m_bExactQuadrantPatch[fvi] 
      ||
      (false == m_bExtraordinaryCornerVertex[fvi] && bEnableApproximatePatch))
    {
      dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 0, 0);
      P1[0] = &m_srf_cv1[dex.i][dex.j][0];
      if (ON_IsValid(P1[0][0]))
      {
        ++set_cv_count;
      }
      else
      {
        if ( center_vertices[fvi]->IsSmooth() )
        {
          if (4 == center_vertices[fvi]->m_edge_count && 4 == center_vertices[fvi]->m_face_count)
          {
            dex = ON_SubDQuadNeighborhood::GridDex(3, fvi, 0, 0);
            const ON_SubDFace* face_ij = m_face_grid[dex.i][dex.j];
            if (nullptr == face_ij)
              return ON_SUBD_RETURN_ERROR(0);
            if (!face_ij->GetSubdivisionPoint(Q[0]))
              return ON_SUBD_RETURN_ERROR(0);
            ++set_cv_count;
            P1[0][0] = Q[0][0]; P1[0][1] = Q[0][1]; P1[0][2] = Q[0][2];
          }
        }
        else  if (center_vertices[fvi]->IsCrease())
        {
          if (m_bBoundaryCrease[fvi] && m_bBoundaryCrease[fvi3])
          {
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 2, 1);
            Q[0][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[0][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[0][2] = m_srf_cv1[dex.i][dex.j][2];
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 1, 2);
            Q[1][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[1][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[1][2] = m_srf_cv1[dex.i][dex.j][2];
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 2, 2);
            Q[2][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[2][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[2][2] = m_srf_cv1[dex.i][dex.j][2];

            if (ON_IsValid(Q[0][0]) && ON_IsValid(Q[1][0]) && ON_IsValid(Q[2][0]))
            {
              dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 1, 1);
              if (ON_IsValid(m_srf_cv1[dex.i][dex.j][0]))
              {
                const double c = -8.0;
                const double b = 4.0;
                ++set_cv_count;
                P1[0][0] = c * m_srf_cv1[dex.i][dex.j][0] + b * (Q[0][0] + Q[1][0]) + Q[2][0];
                P1[0][1] = c * m_srf_cv1[dex.i][dex.j][1] + b * (Q[0][1] + Q[1][1]) + Q[2][1];
                P1[0][2] = c * m_srf_cv1[dex.i][dex.j][2] + b * (Q[0][2] + Q[1][2]) + Q[2][2];
              }
            }
          }
          else if (m_bBoundaryCrease[fvi] && false == m_bBoundaryCrease[fvi3])
          {
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 0, 1);
            Q[0][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[0][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[0][2] = m_srf_cv1[dex.i][dex.j][2];
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 0, 2);
            Q[1][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[1][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[1][2] = m_srf_cv1[dex.i][dex.j][2];

            if (ON_IsValid(Q[0][0]) && ON_IsValid(Q[1][0]))
            {
              ++set_cv_count;
              P1[0][0] = 2.0 * Q[0][0] - Q[1][0];
              P1[0][1] = 2.0 * Q[0][1] - Q[1][1];
              P1[0][2] = 2.0 * Q[0][2] - Q[1][2];
            }
          }
          else if (false == m_bBoundaryCrease[fvi] && m_bBoundaryCrease[fvi3])
          {
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 1, 0);
            Q[0][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[0][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[0][2] = m_srf_cv1[dex.i][dex.j][2];
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 2, 0);
            Q[1][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[1][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[1][2] = m_srf_cv1[dex.i][dex.j][2];

            if (ON_IsValid(Q[0][0]) && ON_IsValid(Q[1][0]))
            {
              ++set_cv_count;
              P1[0][0] = 2.0 * Q[0][0] - Q[1][0];
              P1[0][1] = 2.0 * Q[0][1] - Q[1][1];
              P1[0][2] = 2.0 * Q[0][2] - Q[1][2];
            }
          }
          else if (m_bExactQuadrantPatch[fvi])
          {
            ON_SUBD_ERROR("Why is this happening?");
          }
        }
      }
    }
    if (16 == set_cv_count)
    {
      // quadrant with index fvi is set;
      ++set_quadrant_count;
    }
  }

  if (exact_quadrant_count > set_quadrant_count)
    return ON_SUBD_RETURN_ERROR(set_quadrant_count);

  return set_quadrant_count;
}